

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menus.cpp
# Opt level: O0

bool __thiscall
CMenus::DoButton_GridHeader
          (CMenus *this,void *pID,char *pText,bool Checked,int Align,CUIRect *pRect,int Corners)

{
  bool bVar1;
  CUI *pCVar2;
  void *pvVar3;
  undefined1 in_CL;
  CUI *in_RDX;
  void *in_RSI;
  undefined8 in_RDI;
  undefined4 in_R8D;
  CUI *in_R9;
  long in_FS_OFFSET;
  CUIRect Label;
  undefined4 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff80;
  float in_stack_ffffffffffffff84;
  CUI *in_stack_ffffffffffffff88;
  CUI *in_stack_ffffffffffffff90;
  undefined3 in_stack_ffffffffffffffac;
  uint uVar4;
  vector4_base<float> local_28;
  anon_union_4_2_94730227_for_vector4_base<float>_1 in_stack_ffffffffffffffe8;
  anon_union_4_2_947300d3_for_vector4_base<float>_3 in_stack_ffffffffffffffec;
  vec4 *in_stack_fffffffffffffff0;
  CUIRect *this_00;
  
  this_00 = *(CUIRect **)(in_FS_OFFSET + 0x28);
  uVar4 = CONCAT13(in_CL,in_stack_ffffffffffffffac) & 0x1ffffff;
  if ((char)(uVar4 >> 0x18) == '\0') {
    pCVar2 = CComponent::UI((CComponent *)0x172afb);
    pvVar3 = CUI::HotItem(pCVar2);
    pCVar2 = in_R9;
    if (pvVar3 == in_RSI) {
      vector4_base<float>::vector4_base(&local_28,1.0,1.0,1.0,0.5);
      CUIRect::Draw(this_00,in_stack_fffffffffffffff0,in_stack_ffffffffffffffec.y,
                    (int)in_stack_ffffffffffffffe8);
      in_stack_ffffffffffffff88 = in_R9;
    }
  }
  else {
    pCVar2 = in_R9;
    vector4_base<float>::vector4_base
              ((vector4_base<float> *)&stack0xffffffffffffffe8,0.9,0.9,0.9,0.5);
    CUIRect::Draw(this_00,in_stack_fffffffffffffff0,in_stack_ffffffffffffffec.y,
                  (int)in_stack_ffffffffffffffe8);
    CComponent::TextRender((CComponent *)0x172ac7);
    ITextRender::TextColor
              ((ITextRender *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
               (vec4 *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    CComponent::TextRender((CComponent *)0x172ae0);
    ITextRender::TextSecondaryColor
              ((ITextRender *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
               (vec4 *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    in_stack_ffffffffffffff90 = in_R9;
  }
  CUIRect::VMargin((CUIRect *)in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,
                   (CUIRect *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  CComponent::UI((CComponent *)0x172b75);
  CUI::DoLabel(in_RDX,(CUIRect *)CONCAT44(uVar4,in_R8D),&pCVar2->m_Enabled,
               (float)((ulong)in_RDI >> 0x20),(int)in_RDI,
               (float)((ulong)in_stack_ffffffffffffff90 >> 0x20),
               SUB81((ulong)in_stack_ffffffffffffff90 >> 0x18,0));
  if ((uVar4 & 0x1000000) != 0) {
    CComponent::TextRender((CComponent *)0x172bca);
    ITextRender::TextColor
              ((ITextRender *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
               (vec4 *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    CComponent::TextRender((CComponent *)0x172be3);
    ITextRender::TextSecondaryColor
              ((ITextRender *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
               (vec4 *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  }
  CComponent::UI((CComponent *)0x172bfc);
  bVar1 = CUI::DoButtonLogic(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                             (CUIRect *)
                             CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                             in_stack_ffffffffffffff7c);
  if (*(CUIRect **)(in_FS_OFFSET + 0x28) != this_00) {
    __stack_chk_fail();
  }
  return bVar1;
}

Assistant:

bool CMenus::DoButton_GridHeader(const void *pID, const char *pText, bool Checked, int Align, const CUIRect *pRect, int Corners)
{
	if(Checked)
	{
		pRect->Draw(vec4(0.9f, 0.9f, 0.9f, 0.5f), 5.0f, Corners);
		TextRender()->TextColor(CUI::ms_HighlightTextColor);
		TextRender()->TextSecondaryColor(CUI::ms_HighlightTextOutlineColor);
	}
	else if(UI()->HotItem() == pID)
	{
		pRect->Draw(vec4(1.0f, 1.0f, 1.0f, 0.5f), 5.0f, Corners);
	}

	CUIRect Label;
	pRect->VMargin(2.0f, &Label);
	UI()->DoLabel(&Label, pText, Label.h*CUI::ms_FontmodHeight*0.8f, Align|TEXTALIGN_MIDDLE);

	if(Checked)
	{
		TextRender()->TextColor(CUI::ms_DefaultTextColor);
		TextRender()->TextSecondaryColor(CUI::ms_DefaultTextOutlineColor);
	}

	return UI()->DoButtonLogic(pID, pRect);
}